

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::HDF5DataParameter::Clear(HDF5DataParameter *this)

{
  string *psVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    if ((this->source_).ptr_ ==
        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x6983);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_50,
                         "CHECK failed: !source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      google::protobuf::internal::LogFinisher::operator=(&local_51,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_50);
    }
    psVar1 = (this->source_).ptr_;
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  if (((this->_has_bits_).has_bits_[0] & 6) != 0) {
    this->shuffle_ = false;
    this->batch_size_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void HDF5DataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.HDF5DataParameter)
  if (has_source()) {
    GOOGLE_DCHECK(!source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*source_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 6u) {
    ::memset(&batch_size_, 0, reinterpret_cast<char*>(&shuffle_) -
      reinterpret_cast<char*>(&batch_size_) + sizeof(shuffle_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}